

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.cpp
# Opt level: O1

void __thiscall QueryResult::do_and(QueryResult *this,QueryResult *other,QueryCounter *counter)

{
  QueryOperation op;
  QueryOperation local_20;
  
  local_20.parent = counter;
  local_20.start_.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if (other->has_everything == false) {
    if (this->has_everything == true) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,other);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&(this->results).run_,&(other->results).run_);
      this->has_everything = other->has_everything;
    }
    else {
      SortedRun::do_and(&this->results,&other->results);
    }
  }
  QueryOperation::~QueryOperation(&local_20);
  return;
}

Assistant:

void QueryResult::do_and(QueryResult &&other, QueryCounter *counter) {
    auto op = QueryOperation(counter);
    if (other.is_everything()) {
    } else if (this->is_everything()) {
        results = std::move(other.results);
        has_everything = other.has_everything;
    } else {
        results.do_and(other.results);
    }
}